

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ExtensionSet::InternalExtensionMergeFrom
          (ExtensionSet *this,MessageLite *extendee,int number,Extension *other_extension,
          Arena *other_arena)

{
  byte bVar1;
  byte bVar2;
  FieldDescriptor *pFVar3;
  int iVar4;
  Extension *dst_extension;
  anon_union_8_9_fdc4a54a_for_Extension_0 other;
  undefined4 extraout_var;
  MessageLite *pMVar5;
  Extension *pEVar6;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar7;
  MessageLite *this_00;
  
  pFVar3 = other_extension->descriptor;
  pEVar6 = other_extension;
  pVar7 = Insert(this,number);
  dst_extension = pVar7.first;
  dst_extension->descriptor = pFVar3;
  if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    InternalExtensionMergeFromIntoUninitializedExtension
              (this,dst_extension,pVar7._8_8_,(int)pEVar6,other_extension,other_arena);
    return;
  }
  if (other_extension->is_repeated == true) {
    bVar1 = dst_extension->type;
    if (bVar1 == other_extension->type) {
      if (dst_extension->is_packed != other_extension->is_packed) goto LAB_003fe4f8;
      if (dst_extension->is_repeated == false) goto LAB_003fe508;
      if (0xed < (byte)(bVar1 - 0x13)) {
        switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4)) {
        case 1:
        case 8:
          RepeatedField<int>::MergeFrom
                    ((RepeatedField<int> *)dst_extension->field_0,
                     (RepeatedField<int> *)other_extension->field_0);
          return;
        case 2:
          RepeatedField<long>::MergeFrom
                    ((RepeatedField<long> *)dst_extension->field_0,
                     (RepeatedField<long> *)other_extension->field_0);
          return;
        case 3:
          RepeatedField<unsigned_int>::MergeFrom
                    ((RepeatedField<unsigned_int> *)dst_extension->field_0,
                     (RepeatedField<unsigned_int> *)other_extension->field_0);
          return;
        case 4:
          RepeatedField<unsigned_long>::MergeFrom
                    ((RepeatedField<unsigned_long> *)dst_extension->field_0,
                     (RepeatedField<unsigned_long> *)other_extension->field_0);
          return;
        case 5:
          RepeatedField<double>::MergeFrom
                    ((RepeatedField<double> *)dst_extension->field_0,
                     (RepeatedField<double> *)other_extension->field_0);
          return;
        case 6:
          RepeatedField<float>::MergeFrom
                    ((RepeatedField<float> *)dst_extension->field_0,
                     (RepeatedField<float> *)other_extension->field_0);
          return;
        case 7:
          RepeatedField<bool>::MergeFrom
                    ((RepeatedField<bool> *)dst_extension->field_0,
                     (RepeatedField<bool> *)other_extension->field_0);
          return;
        case 9:
          goto switchD_003fe2a4_caseD_9;
        case 10:
          if (((RepeatedPtrFieldBase *)(other_extension->field_0).int64_t_value)->current_size_ == 0
             ) {
            return;
          }
          RepeatedPtrFieldBase::MergeFrom<google::protobuf::MessageLite>
                    ((RepeatedPtrFieldBase *)dst_extension->field_0,
                     (RepeatedPtrFieldBase *)(other_extension->field_0).int64_t_value);
          return;
        default:
          return;
        }
      }
    }
    else {
      InternalExtensionMergeFrom();
LAB_003fe4f8:
      InternalExtensionMergeFrom();
LAB_003fe508:
      InternalExtensionMergeFrom((ExtensionSet *)&stack0xffffffffffffffc0);
    }
    InternalExtensionMergeFrom((ExtensionSet *)&stack0xffffffffffffffc0);
LAB_003fe51c:
    InternalExtensionMergeFrom((ExtensionSet *)&stack0xffffffffffffffc0);
LAB_003fe526:
    InternalExtensionMergeFrom();
LAB_003fe533:
    InternalExtensionMergeFrom();
LAB_003fe544:
    InternalExtensionMergeFrom((ExtensionSet *)&stack0xffffffffffffffc0);
  }
  if ((other_extension->field_0xa & 2) != 0) {
    return;
  }
  bVar1 = dst_extension->field_0xa;
  dst_extension->field_0xa = bVar1 & 0xfd;
  bVar2 = other_extension->type;
  if ((byte)(bVar2 - 0x13) < 0xee) goto LAB_003fe51c;
  switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar2 * 4)) {
  case 1:
  case 3:
  case 8:
    (dst_extension->field_0).int32_t_value = (other_extension->field_0).int32_t_value;
    break;
  case 2:
  case 4:
    dst_extension->field_0 = other_extension->field_0;
    break;
  case 5:
    dst_extension->field_0 = other_extension->field_0;
    break;
  case 6:
    (dst_extension->field_0).int32_t_value = (other_extension->field_0).int32_t_value;
    break;
  case 7:
    (dst_extension->field_0).bool_value = (other_extension->field_0).bool_value;
    break;
  case 9:
    std::__cxx11::string::_M_assign((string *)dst_extension->field_0);
    return;
  case 10:
    if (dst_extension->type != bVar2) goto LAB_003fe526;
    if (dst_extension->is_packed == other_extension->is_packed) {
      if (dst_extension->is_repeated == false) {
        this_00 = (MessageLite *)(dst_extension->field_0).int64_t_value;
        if ((other_extension->field_0xa & 4) == 0) {
          other = (anon_union_8_9_fdc4a54a_for_Extension_0)(other_extension->field_0).int64_t_value;
          if ((bVar1 & 4) != 0) {
            iVar4 = (*this_00->_vptr_MessageLite[5])(this_00,other.int64_t_value,this->arena_);
            this_00 = (MessageLite *)CONCAT44(extraout_var,iVar4);
            other = other_extension->field_0;
          }
        }
        else {
          if ((bVar1 & 4) != 0) {
            pMVar5 = GetPrototypeForLazyMessage(this,extendee,number);
            (*this_00->_vptr_MessageLite[0x10])
                      (this_00,pMVar5,(other_extension->field_0).int64_t_value,this->arena_,
                       other_arena,this_00->_vptr_MessageLite[0x10]);
            return;
          }
          other.int64_t_value =
               (**(code **)(**(long **)&(other_extension->field_0).int32_t_value + 0x18))
                         (*(long **)&(other_extension->field_0).int32_t_value,this_00,other_arena);
        }
        MessageLite::CheckTypeAndMergeFrom(this_00,(MessageLite *)other);
        return;
      }
      goto LAB_003fe544;
    }
    goto LAB_003fe533;
  }
  return;
switchD_003fe2a4_caseD_9:
  if (((RepeatedPtrFieldBase *)(other_extension->field_0).int64_t_value)->current_size_ == 0) {
    return;
  }
  RepeatedPtrFieldBase::MergeFrom<std::__cxx11::string>
            ((RepeatedPtrFieldBase *)dst_extension->field_0,
             (RepeatedPtrFieldBase *)(other_extension->field_0).int64_t_value);
  return;
}

Assistant:

void ExtensionSet::InternalExtensionMergeFrom(const MessageLite* extendee,
                                              int number,
                                              const Extension& other_extension,
                                              Arena* other_arena) {
  Extension* dst_extension;
  bool is_new =
      MaybeNewExtension(number, other_extension.descriptor, &dst_extension);
  if (is_new) {
    InternalExtensionMergeFromIntoUninitializedExtension(
        *dst_extension, extendee, number, other_extension, other_arena);
    return;
  }
  if (other_extension.is_repeated) {
    ABSL_DCHECK_EQ(dst_extension->type, other_extension.type);
    ABSL_DCHECK_EQ(dst_extension->is_packed, other_extension.is_packed);
    ABSL_DCHECK(dst_extension->is_repeated);

    switch (cpp_type(other_extension.type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                       \
  case WireFormatLite::CPPTYPE_##UPPERCASE:                     \
    dst_extension->ptr.repeated_##LOWERCASE##_value->MergeFrom( \
        *other_extension.ptr.repeated_##LOWERCASE##_value);     \
    break;

      HANDLE_TYPE(INT32, int32_t);
      HANDLE_TYPE(INT64, int64_t);
      HANDLE_TYPE(UINT32, uint32_t);
      HANDLE_TYPE(UINT64, uint64_t);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(ENUM, enum);
      HANDLE_TYPE(STRING, string);
      HANDLE_TYPE(MESSAGE, message);
#undef HANDLE_TYPE
    }
    return;
  }

  if (other_extension.is_cleared) {
    return;
  }
  dst_extension->is_cleared = false;
  switch (cpp_type(other_extension.type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                                 \
  case WireFormatLite::CPPTYPE_##UPPERCASE:                               \
    dst_extension->LOWERCASE##_value = other_extension.LOWERCASE##_value; \
    break;

    HANDLE_TYPE(INT32, int32_t);
    HANDLE_TYPE(INT64, int64_t);
    HANDLE_TYPE(UINT32, uint32_t);
    HANDLE_TYPE(UINT64, uint64_t);
    HANDLE_TYPE(FLOAT, float);
    HANDLE_TYPE(DOUBLE, double);
    HANDLE_TYPE(BOOL, bool);
    HANDLE_TYPE(ENUM, enum);
#undef HANDLE_TYPE
    case WireFormatLite::CPPTYPE_STRING:
      dst_extension->ptr.string_value->assign(
          *other_extension.ptr.string_value);
      break;
    case WireFormatLite::CPPTYPE_MESSAGE: {
      ABSL_DCHECK_EQ(dst_extension->type, other_extension.type);
      ABSL_DCHECK_EQ(dst_extension->is_packed, other_extension.is_packed);
      ABSL_DCHECK(!dst_extension->is_repeated);
      if (other_extension.is_lazy) {
        if (dst_extension->is_lazy) {
          dst_extension->ptr.lazymessage_value->MergeFrom(
              GetPrototypeForLazyMessage(extendee, number),
              *other_extension.ptr.lazymessage_value, arena_, other_arena);
        } else {
          dst_extension->ptr.message_value->CheckTypeAndMergeFrom(
              other_extension.ptr.lazymessage_value->GetMessage(
                  *dst_extension->ptr.message_value, other_arena));
        }
      } else {
        if (dst_extension->is_lazy) {
          dst_extension->ptr.lazymessage_value
              ->MutableMessage(*other_extension.ptr.message_value, arena_)
              ->CheckTypeAndMergeFrom(*other_extension.ptr.message_value);
        } else {
          dst_extension->ptr.message_value->CheckTypeAndMergeFrom(
              *other_extension.ptr.message_value);
        }
      }
      break;
    }
  }
}